

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprinter.cc
# Opt level: O0

string * __thiscall
tinyusdz::print_animatable_default<std::array<float,2ul>>
          (string *__return_storage_ptr__,tinyusdz *this,Animatable<std::array<float,_2UL>_> *v,
          uint32_t indent)

{
  bool bVar1;
  allocator local_1b1;
  array<float,_2UL> local_1b0;
  array<float,_2UL> a;
  stringstream ss;
  ostream aoStack_198 [380];
  undefined4 local_1c;
  Animatable<std::array<float,_2UL>_> *pAStack_18;
  uint32_t indent_local;
  Animatable<std::array<float,_2UL>_> *v_local;
  
  local_1c = SUB84(v,0);
  pAStack_18 = (Animatable<std::array<float,_2UL>_> *)this;
  v_local = (Animatable<std::array<float,_2UL>_> *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&a);
  bVar1 = Animatable<std::array<float,_2UL>_>::is_blocked(pAStack_18);
  if (bVar1) {
    ::std::operator<<(aoStack_198,"None");
  }
  bVar1 = Animatable<std::array<float,_2UL>_>::has_value(pAStack_18);
  if (bVar1) {
    bVar1 = Animatable<std::array<float,_2UL>_>::get_scalar(pAStack_18,&local_1b0);
    if (!bVar1) {
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                ((string *)__return_storage_ptr__,"[Animatable: InternalError]",&local_1b1);
      ::std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
      goto LAB_0044052e;
    }
    ::std::operator<<(aoStack_198,&local_1b0);
  }
  ::std::__cxx11::stringstream::str();
LAB_0044052e:
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&a);
  return __return_storage_ptr__;
}

Assistant:

std::string print_animatable_default(const Animatable<T> &v,
                             const uint32_t indent = 0) {
  (void)indent;

  std::stringstream ss;

  if (v.is_blocked()) {
    ss << "None";
  }

  if (v.has_value()) {
    T a;
    if (!v.get_scalar(&a)) {
      return "[Animatable: InternalError]";
    }
    ss << a;
  }

  return ss.str();
}